

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O2

void google::protobuf::compiler::cxx::PrintHandlingOptionalStaticInitializers
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *vars,FileDescriptor *file,Printer *printer,char *with_static_init,
               char *without_static_init)

{
  bool bVar1;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = StaticInitializersForced(file);
  if (bVar1) {
    io::Printer::Print(printer,vars,with_static_init);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n",&local_c9);
  std::operator+(&local_c8,&local_48,without_static_init);
  std::operator+(&local_a8,&local_c8,"#else\n");
  std::operator+(&local_88,&local_a8,with_static_init);
  std::operator+(&local_68,&local_88,"#endif\n");
  io::Printer::Print(printer,vars,local_68._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void PrintHandlingOptionalStaticInitializers(
    const map<string, string>& vars, const FileDescriptor* file,
    io::Printer* printer, const char* with_static_init,
    const char* without_static_init) {
  if (StaticInitializersForced(file)) {
    printer->Print(vars, with_static_init);
  } else {
    printer->Print(vars, (string(
      "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n") +
      without_static_init +
      "#else\n" +
      with_static_init +
      "#endif\n").c_str());
  }
}